

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool google::anon_unknown_1::AddFlagValidator(void *flag_ptr,ValidateFnProto validate_fn_proto)

{
  CommandLineFlag *this;
  ostream *poVar1;
  ValidateFnProto p_Var2;
  char *pcVar3;
  CommandLineFlag *flag;
  FlagRegistryLock frl;
  FlagRegistry *registry;
  ValidateFnProto validate_fn_proto_local;
  void *flag_ptr_local;
  
  frl.fr_ = FlagRegistry::GlobalRegistry();
  FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&flag,frl.fr_);
  this = FlagRegistry::FindFlagViaPtrLocked(frl.fr_,flag_ptr);
  if (this == (CommandLineFlag *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Ignoring RegisterValidateFunction() for flag pointer ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,flag_ptr);
    std::operator<<(poVar1,": no flag found at that address");
    flag_ptr_local._7_1_ = false;
  }
  else {
    p_Var2 = CommandLineFlag::validate_function(this);
    if (validate_fn_proto == p_Var2) {
      flag_ptr_local._7_1_ = true;
    }
    else {
      if (validate_fn_proto != (ValidateFnProto)0x0) {
        p_Var2 = CommandLineFlag::validate_function(this);
        if (p_Var2 != (ValidateFnProto)0x0) {
          poVar1 = std::operator<<((ostream *)&std::cerr,
                                   "Ignoring RegisterValidateFunction() for flag \'");
          pcVar3 = CommandLineFlag::name(this);
          poVar1 = std::operator<<(poVar1,pcVar3);
          std::operator<<(poVar1,"\': validate-fn already registered");
          flag_ptr_local._7_1_ = false;
          goto LAB_0028487d;
        }
      }
      this->validate_fn_proto_ = validate_fn_proto;
      flag_ptr_local._7_1_ = true;
    }
  }
LAB_0028487d:
  FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&flag);
  return flag_ptr_local._7_1_;
}

Assistant:

bool AddFlagValidator(const void* flag_ptr, ValidateFnProto validate_fn_proto) {
  // We want a lock around this routine, in case two threads try to
  // add a validator (hopefully the same one!) at once.  We could use
  // our own thread, but we need to loook at the registry anyway, so
  // we just steal that one.
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  // First, find the flag whose current-flag storage is 'flag'.
  // This is the CommandLineFlag whose current_->value_buffer_ == flag
  CommandLineFlag* flag = registry->FindFlagViaPtrLocked(flag_ptr);
  if (!flag) {
    LOG(WARNING) << "Ignoring RegisterValidateFunction() for flag pointer "
                 << flag_ptr << ": no flag found at that address";
    return false;
  } else if (validate_fn_proto == flag->validate_function()) {
    return true;    // ok to register the same function over and over again
  } else if (validate_fn_proto != NULL && flag->validate_function() != NULL) {
    LOG(WARNING) << "Ignoring RegisterValidateFunction() for flag '"
                 << flag->name() << "': validate-fn already registered";
    return false;
  } else {
    flag->validate_fn_proto_ = validate_fn_proto;
    return true;
  }
}